

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularBuffer.cpp
# Opt level: O1

int __thiscall
JetHead::CircularBuffer::waitForData(CircularBuffer *this,int threshold,uint32_t msecs)

{
  undefined1 auVar1 [16];
  bool bVar2;
  uint32_t uVar3;
  timeval tv_1;
  AutoLock lock;
  timeval local_58;
  AutoLock local_48;
  
  gettimeofday((timeval *)&local_48,(__timezone_ptr_t)0x0);
  AutoLock::AutoLock(&local_48,&this->mLock);
  if ((int)this->mLen < threshold) {
    uVar3 = msecs;
    do {
      bVar2 = Condition::Wait(&this->mDataCondition,&this->mLock,uVar3);
      if (!bVar2) break;
      gettimeofday(&local_58,(__timezone_ptr_t)0x0);
      auVar1 = SEXT816((local_58.tv_usec - (long)local_48.mFile) * 1000) *
               SEXT816(0x431bde82d7b634db);
      uVar3 = msecs - (((int)local_58.tv_sec - (int)local_48.mMutex) * 1000 +
                      ((int)(auVar1._8_8_ >> 0x12) - (auVar1._12_4_ >> 0x1f)));
    } while ((int)this->mLen < threshold);
  }
  uVar3 = 0;
  if (threshold <= (int)this->mLen) {
    uVar3 = this->mLen;
  }
  AutoLock::~AutoLock(&local_48);
  return uVar3;
}

Assistant:

int CircularBuffer::waitForData( int threshold, uint32_t msecs )
{
	TRACE_BEGIN( LOG_LVL_NOISE );
	
	uint32_t timeout = msecs;	
	struct timespec start, cur;
	TimeUtils::getCurTime( &start );
	
	LOG_NOISE( "Waiting for data %d cur size %d timeout %d", threshold, length_internal(), msecs );

	AutoLock lock( mLock );
	
	if ( length_internal() < threshold )
		LOG_INFO( "buffer underflow" );
	
	while ( length_internal() < threshold && mDataCondition.Wait( mLock, timeout ) )
	{
		TimeUtils::getCurTime( &cur );
		timeout = msecs - TimeUtils::getDifference( &cur, &start );
		
		LOG_INFO( "Wating for data %d cur size %d msecs remaining %d", threshold, length_internal(), timeout );
	}

	if ( length_internal() >= threshold )
		return length_internal();
	else
		return 0;
}